

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_utils.h
# Opt level: O2

bool draco::EncodeVarint<int>(int val,EncoderBuffer *out_buffer)

{
  bool bVar1;
  uint val_00;
  
  val_00 = ~val * 2 + 1;
  if (-1 < val) {
    val_00 = val * 2;
  }
  bVar1 = EncodeVarint<unsigned_int>(val_00,out_buffer);
  return bVar1;
}

Assistant:

typename std::make_unsigned<IntTypeT>::type ConvertSignedIntToSymbol(
    IntTypeT val) {
  typedef typename std::make_unsigned<IntTypeT>::type UnsignedType;
  static_assert(std::is_integral<IntTypeT>::value, "IntTypeT is not integral.");
  // Early exit if val is positive.
  if (val >= 0) {
    return static_cast<UnsignedType>(val) << 1;
  }
  val = -(val + 1);  // Map -1 to 0, -2 to -1, etc..
  UnsignedType ret = static_cast<UnsignedType>(val);
  ret <<= 1;
  ret |= 1;
  return ret;
}